

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int ARKodeResVtolerance(void *arkode_mem,N_Vector rabstol)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  double dVar2;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar1 = 0x1f8;
LAB_0015c46b:
    arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeResVtolerance",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,msgfmt);
    return error_code;
  }
  if (*(int *)((long)arkode_mem + 0x200) == 0) {
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    error_code = -0x30;
    iVar1 = 0x201;
    goto LAB_0015c46b;
  }
  if (*(int *)((long)arkode_mem + 0x3c0) == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    error_code = -0x17;
    iVar1 = 0x209;
    goto LAB_0015c46b;
  }
  if (rabstol == (N_Vector)0x0) {
    msgfmt = "rabstol = NULL illegal.";
    error_code = -0x17;
    iVar1 = 0x20f;
    goto LAB_0015c46b;
  }
  if (rabstol->ops->nvmin == (_func_sunrealtype_N_Vector *)0x0) {
    msgfmt = "Missing N_VMin routine from N_Vector";
    error_code = -0x16;
    iVar1 = 0x215;
    goto LAB_0015c46b;
  }
  dVar2 = (double)N_VMin(rabstol);
  if (dVar2 < 0.0) {
    msgfmt = "rabstol has negative component(s) (illegal).";
    error_code = -0x16;
    iVar1 = 0x21c;
    goto LAB_0015c46b;
  }
  *(uint *)((long)arkode_mem + 0x50) = -(uint)(dVar2 == 0.0) & 1;
  if (*(int *)((long)arkode_mem + 0x240) != 0) {
    *(undefined8 *)((long)arkode_mem + 0x238) = 0;
    iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x230),
                        (N_Vector *)((long)arkode_mem + 0x238));
    if (iVar1 == 0) {
      iVar1 = 0x22a;
      goto LAB_0015c55c;
    }
    *(undefined4 *)((long)arkode_mem + 0x240) = 0;
  }
  if (*(int *)((long)arkode_mem + 0x3bc) == 0) {
    iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x238),
                        (N_Vector *)((long)arkode_mem + 0x48));
    if (iVar1 == 0) {
      iVar1 = 0x236;
LAB_0015c55c:
      arkProcessError((ARKodeMem)arkode_mem,-0x14,iVar1,"ARKodeResVtolerance",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"Allocation of arkode_mem failed.");
      return -0x16;
    }
    *(undefined4 *)((long)arkode_mem + 0x3bc) = 1;
  }
  N_VScale(0x3ff0000000000000,rabstol,*(undefined8 *)((long)arkode_mem + 0x48));
  *(undefined4 *)((long)arkode_mem + 0x1c) = 1;
  *(undefined4 *)((long)arkode_mem + 0x54) = 0;
  *(code **)((long)arkode_mem + 0x70) = arkRwtSet;
  *(void **)((long)arkode_mem + 0x78) = arkode_mem;
  return 0;
}

Assistant:

int ARKodeResVtolerance(void* arkode_mem, N_Vector rabstol)
{
  /* local variables */
  sunrealtype rabstolmin;

  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Check inputs */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }
  if (rabstol == NULL)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_RABSTOL);
    return (ARK_NO_MALLOC);
  }
  if (rabstol->ops->nvmin == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Missing N_VMin routine from N_Vector");
    return (ARK_ILL_INPUT);
  }
  rabstolmin = N_VMin(rabstol);
  if (rabstolmin < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_RABSTOL);
    return (ARK_ILL_INPUT);
  }

  /* Set flag indicating whether min(abstol) == 0 */
  ark_mem->Ratolmin0 = (rabstolmin == ZERO);

  /* Allocate space for rwt if necessary */
  if (ark_mem->rwt_is_ewt)
  {
    ark_mem->rwt = NULL;
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->rwt)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_ILL_INPUT);
    }
    ark_mem->rwt_is_ewt = SUNFALSE;
  }

  /* Copy tolerances into memory */
  if (!(ark_mem->VRabstolMallocDone))
  {
    if (!arkAllocVec(ark_mem, ark_mem->rwt, &(ark_mem->VRabstol)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_ILL_INPUT);
    }
    ark_mem->VRabstolMallocDone = SUNTRUE;
  }
  N_VScale(ONE, rabstol, ark_mem->VRabstol);
  ark_mem->ritol = ARK_SV;

  /* enforce use of arkRwtSet */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->rfun      = arkRwtSet;
  ark_mem->r_data    = ark_mem;

  return (ARK_SUCCESS);
}